

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O1

FunctionDefinition * __thiscall
stackjit::ClassMetadata::getVirtualFunctionRootDefinition
          (ClassMetadata *this,FunctionDefinition *funcDef)

{
  pointer ppFVar1;
  FunctionDefinition *this_00;
  size_t __n;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ClassMetadata *pCVar6;
  string *psVar7;
  string *psVar8;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *list1;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *list2;
  pointer ppFVar9;
  FunctionDefinition *local_48;
  
  if (this->mParentClass != (ClassType *)0x0) {
    pCVar6 = ClassType::metadata(this->mParentClass);
    ppFVar1 = (pCVar6->mVirtualFunctions).
              super__Vector_base<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar9 = (pCVar6->mVirtualFunctions).
                   super__Vector_base<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; bVar3 = ppFVar9 != ppFVar1, bVar3;
        ppFVar9 = ppFVar9 + 1) {
      this_00 = *ppFVar9;
      psVar7 = FunctionDefinition::memberName_abi_cxx11_(funcDef);
      psVar8 = FunctionDefinition::memberName_abi_cxx11_(this_00);
      __n = psVar7->_M_string_length;
      bVar2 = true;
      if ((__n == psVar8->_M_string_length) &&
         ((__n == 0 ||
          (iVar5 = bcmp((psVar7->_M_dataplus)._M_p,(psVar8->_M_dataplus)._M_p,__n), iVar5 == 0)))) {
        list1 = FunctionDefinition::callParameters(funcDef);
        list2 = FunctionDefinition::callParameters(this_00);
        bVar4 = TypeSystem::areEqual(list1,list2);
        if (bVar4) {
          pCVar6 = ClassType::metadata(this->mParentClass);
          local_48 = getVirtualFunctionRootDefinition(pCVar6,this_00);
          bVar2 = false;
        }
      }
      if (!bVar2) break;
    }
    if (bVar3) {
      return local_48;
    }
  }
  return funcDef;
}

Assistant:

const FunctionDefinition* ClassMetadata::getVirtualFunctionRootDefinition(const FunctionDefinition* funcDef) const {
		if (mParentClass != nullptr) {
			for (auto parentDef : mParentClass->metadata()->mVirtualFunctions) {
				if (funcDef->memberName() == parentDef->memberName()
					&& TypeSystem::areEqual(funcDef->callParameters(), parentDef->callParameters())) {
					return mParentClass->metadata()->getVirtualFunctionRootDefinition(parentDef);
				}
			}
		}

		return funcDef;
	}